

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase148::run(TestCase148 *this)

{
  char *in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int in_R8D;
  bool bVar1;
  uint local_2b8;
  int callerCallCount;
  undefined1 local_2b0 [16];
  uint *local_2a0;
  uint local_290;
  undefined1 local_288 [24];
  WaitScope waitScope;
  int calleeCallCount;
  undefined1 local_258 [24];
  Response<capnproto_test::capnp::test::TestTailCallee::TailResult> response;
  Client caller;
  Client callee;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall2;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall1;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall0;
  RemotePromise<capnproto_test::capnp::test::TestTailCallee::TailResult> promise;
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  request;
  EventLoop loop;
  Maybe<capnp::MessageSize> local_80;
  Maybe<capnp::MessageSize> local_68;
  Maybe<capnp::MessageSize> local_50;
  Maybe<capnp::MessageSize> local_38;
  
  kj::EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  kj::EventLoop::enterScope(&loop);
  calleeCallCount = 0;
  callerCallCount = 0;
  kj::heap<capnp::_::TestTailCalleeImpl,int&>((kj *)&response,&calleeCallCount);
  capnproto_test::capnp::test::TestTailCallee::Client::Client<capnp::_::TestTailCalleeImpl,void>
            (&callee,(Own<capnp::_::TestTailCalleeImpl> *)&response);
  kj::Own<capnp::_::TestTailCalleeImpl>::dispose((Own<capnp::_::TestTailCalleeImpl> *)&response);
  kj::heap<capnp::_::TestTailCallerImpl,int&>((kj *)&response,&callerCallCount);
  capnproto_test::capnp::test::TestTailCaller::Client::Client<capnp::_::TestTailCallerImpl,void>
            (&caller,(Own<capnp::_::TestTailCallerImpl> *)&response);
  kj::Own<capnp::_::TestTailCallerImpl>::dispose((Own<capnp::_::TestTailCallerImpl> *)&response);
  local_38.ptr.isSet = false;
  capnproto_test::capnp::test::TestTailCaller::Client::fooRequest(&request,&caller,&local_38);
  *(undefined4 *)request.super_Builder._builder.data = 0x1c8;
  capnproto_test::capnp::test::TestTailCaller::FooParams::Builder::setCallee
            (&request.super_Builder,&callee);
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  ::send((Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
          *)&promise,(int)&request,__buf,(size_t)in_RCX,in_R8D);
  capnproto_test::capnp::test::TestTailCallee::TailResult::Pipeline::getC
            ((Client *)local_2b0,&promise.super_Pipeline);
  local_50.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)&response,(Client *)local_2b0,&local_50);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)&dependentCall0,(int)&response,__buf_00,(size_t)in_RCX,in_R8D);
  kj::Own<capnp::RequestHook>::dispose
            ((Own<capnp::RequestHook> *)&response.super_Reader._reader.nestingLimit);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_2b0 + 8));
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestTailCallee::TailResult>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestTailCallee::TailResult>_> *)
             &response,&promise);
  if (response.super_Reader._reader.dataSize < 0x20) {
    if (2 < kj::_::Debug::minSeverity) goto LAB_0030d4f5;
    dependentCall1.
    super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
    .super_PromiseBase.node.disposer._0_4_ = 0;
LAB_0030d443:
    local_2b0._0_4_ = 0x1c8;
    in_RCX = "\"failed: expected \" \"(456) == (response.getI())\", 456, response.getI()";
    in_R8D = 0x4c879b;
    kj::_::Debug::log<char_const(&)[44],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0xa7,ERROR,
               "\"failed: expected \" \"(456) == (response.getI())\", 456, response.getI()",
               (char (*) [44])"failed: expected (456) == (response.getI())",(int *)local_2b0,
               (uint *)&dependentCall1);
    if (0x1f < response.super_Reader._reader.dataSize) goto LAB_0030d49a;
    if (2 < kj::_::Debug::minSeverity) goto LAB_0030d4f5;
    dependentCall1.
    super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
    .super_PromiseBase.node.disposer._0_4_ = 0;
  }
  else {
    if ((*response.super_Reader._reader.data != 0x1c8) &&
       (in_RCX = (char *)&kj::_::Debug::minSeverity, kj::_::Debug::minSeverity < 3)) {
      dependentCall1.
      super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
      .super_PromiseBase.node.disposer._0_4_ = *response.super_Reader._reader.data;
      goto LAB_0030d443;
    }
LAB_0030d49a:
    if ((*response.super_Reader._reader.data == 0x1c8) ||
       (in_RCX = (char *)&kj::_::Debug::minSeverity, 2 < kj::_::Debug::minSeverity))
    goto LAB_0030d4f5;
    dependentCall1.
    super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
    .super_PromiseBase.node.disposer._0_4_ = *response.super_Reader._reader.data;
  }
  local_2b0._0_4_ = 0x1c8;
  in_RCX = "\"failed: expected \" \"(456) == (response.getI())\", 456, response.getI()";
  in_R8D = 0x4c879b;
  kj::_::Debug::log<char_const(&)[44],int,unsigned_int>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
             ,0xa8,ERROR,
             "\"failed: expected \" \"(456) == (response.getI())\", 456, response.getI()",
             (char (*) [44])"failed: expected (456) == (response.getI())",(int *)local_2b0,
             (uint *)&dependentCall1);
LAB_0030d4f5:
  capnproto_test::capnp::test::TestTailCallee::TailResult::Pipeline::getC
            ((Client *)&dependentCall2,&promise.super_Pipeline);
  local_68.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)local_2b0,(Client *)&dependentCall2,&local_68);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)&dependentCall1,(int)local_2b0,__buf_01,(size_t)in_RCX,in_R8D);
  kj::Own<capnp::RequestHook>::dispose((Own<capnp::RequestHook> *)local_288);
  kj::Own<capnp::ClientHook>::dispose
            ((Own<capnp::ClientHook> *)
             &dependentCall2.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
              .super_PromiseBase.node.ptr);
  capnproto_test::capnp::test::TestTailCallee::TailResult::Reader::getC
            ((Client *)local_258,&response.super_Reader);
  local_80.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)local_2b0,(Client *)local_258,&local_80);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)&dependentCall2,(int)local_2b0,__buf_02,(size_t)in_RCX,in_R8D);
  kj::Own<capnp::RequestHook>::dispose((Own<capnp::RequestHook> *)local_288);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_258 + 8));
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_2b0,&dependentCall0);
  if (local_290 < 0x20) {
    bVar1 = false;
  }
  else {
    bVar1 = *local_2a0 != 0;
  }
  kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)(local_288 + 8));
  if ((bool)(bVar1 & kj::_::Debug::minSeverity < 3)) {
    local_258._0_4_ = 0;
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_2b0,&dependentCall0);
    local_2b8 = 0;
    if (0x1f < local_290) {
      local_2b8 = *local_2a0;
    }
    kj::_::Debug::log<char_const(&)[64],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0xae,ERROR,
               "\"failed: expected \" \"(0) == (dependentCall0.wait(waitScope).getN())\", 0, dependentCall0.wait(waitScope).getN()"
               ,(char (*) [64])"failed: expected (0) == (dependentCall0.wait(waitScope).getN())",
               (int *)local_258,&local_2b8);
    kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)(local_288 + 8));
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_2b0,&dependentCall1);
  bVar1 = true;
  if (0x1f < local_290) {
    bVar1 = *local_2a0 != 1;
  }
  kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)(local_288 + 8));
  if ((bool)(bVar1 & kj::_::Debug::minSeverity < 3)) {
    local_258._0_4_ = 1;
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_2b0,&dependentCall1);
    local_2b8 = 0;
    if (0x1f < local_290) {
      local_2b8 = *local_2a0;
    }
    kj::_::Debug::log<char_const(&)[64],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0xaf,ERROR,
               "\"failed: expected \" \"(1) == (dependentCall1.wait(waitScope).getN())\", 1, dependentCall1.wait(waitScope).getN()"
               ,(char (*) [64])"failed: expected (1) == (dependentCall1.wait(waitScope).getN())",
               (int *)local_258,&local_2b8);
    kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)(local_288 + 8));
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_2b0,&dependentCall2);
  bVar1 = true;
  if (0x1f < local_290) {
    bVar1 = *local_2a0 != 2;
  }
  kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)(local_288 + 8));
  if ((bool)(bVar1 & kj::_::Debug::minSeverity < 3)) {
    local_258._0_4_ = 2;
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_2b0,&dependentCall2);
    local_2b8 = 0;
    if (0x1f < local_290) {
      local_2b8 = *local_2a0;
    }
    kj::_::Debug::log<char_const(&)[64],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0xb0,ERROR,
               "\"failed: expected \" \"(2) == (dependentCall2.wait(waitScope).getN())\", 2, dependentCall2.wait(waitScope).getN()"
               ,(char (*) [64])"failed: expected (2) == (dependentCall2.wait(waitScope).getN())",
               (int *)local_258,&local_2b8);
    kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)(local_288 + 8));
  }
  if (kj::_::Debug::minSeverity < 3 && calleeCallCount != 1) {
    local_2b0._0_4_ = 1;
    kj::_::Debug::log<char_const(&)[42],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0xb2,ERROR,"\"failed: expected \" \"(1) == (calleeCallCount)\", 1, calleeCallCount",
               (char (*) [42])"failed: expected (1) == (calleeCallCount)",(int *)local_2b0,
               &calleeCallCount);
  }
  if ((callerCallCount != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_2b0._0_4_ = 1;
    kj::_::Debug::log<char_const(&)[42],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0xb3,ERROR,"\"failed: expected \" \"(1) == (callerCallCount)\", 1, callerCallCount",
               (char (*) [42])"failed: expected (1) == (callerCallCount)",(int *)local_2b0,
               &callerCallCount);
  }
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            (&dependentCall2);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            (&dependentCall1);
  kj::Own<capnp::ResponseHook>::dispose(&response.hook);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            (&dependentCall0);
  RemotePromise<capnproto_test::capnp::test::TestTailCallee::TailResult>::~RemotePromise(&promise);
  kj::Own<capnp::RequestHook>::dispose(&request.hook);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&caller.field_0x8);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&callee.field_0x8);
  kj::WaitScope::~WaitScope(&waitScope);
  kj::EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Capability, TailCall) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int calleeCallCount = 0;
  int callerCallCount = 0;

  test::TestTailCallee::Client callee(kj::heap<TestTailCalleeImpl>(calleeCallCount));
  test::TestTailCaller::Client caller(kj::heap<TestTailCallerImpl>(callerCallCount));

  auto request = caller.fooRequest();
  request.setI(456);
  request.setCallee(callee);

  auto promise = request.send();

  auto dependentCall0 = promise.getC().getCallSequenceRequest().send();

  auto response = promise.wait(waitScope);
  EXPECT_EQ(456, response.getI());
  EXPECT_EQ(456, response.getI());

  auto dependentCall1 = promise.getC().getCallSequenceRequest().send();

  auto dependentCall2 = response.getC().getCallSequenceRequest().send();

  EXPECT_EQ(0, dependentCall0.wait(waitScope).getN());
  EXPECT_EQ(1, dependentCall1.wait(waitScope).getN());
  EXPECT_EQ(2, dependentCall2.wait(waitScope).getN());

  EXPECT_EQ(1, calleeCallCount);
  EXPECT_EQ(1, callerCallCount);
}